

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

MMAL_STATUS_T __thiscall
raspicam::_private::Private_Impl_Still::connectPorts
          (Private_Impl_Still *this,MMAL_PORT_T *output_port,MMAL_PORT_T *input_port,
          MMAL_CONNECTION_T **connection)

{
  MMAL_STATUS_T MVar1;
  
  MVar1 = mmal_connection_create(connection,output_port,input_port,3);
  if (MVar1 == MMAL_SUCCESS) {
    MVar1 = mmal_connection_enable(*connection);
    if (MVar1 == MMAL_SUCCESS) {
      MVar1 = MMAL_SUCCESS;
    }
    else {
      mmal_connection_destroy(*connection);
    }
  }
  return MVar1;
}

Assistant:

MMAL_STATUS_T Private_Impl_Still::connectPorts ( MMAL_PORT_T *output_port, MMAL_PORT_T *input_port, MMAL_CONNECTION_T **connection ) {
            MMAL_STATUS_T status =  mmal_connection_create ( connection, output_port, input_port, MMAL_CONNECTION_FLAG_TUNNELLING | MMAL_CONNECTION_FLAG_ALLOCATION_ON_INPUT );
            if ( status == MMAL_SUCCESS ) {
                status =  mmal_connection_enable ( *connection );
                if ( status != MMAL_SUCCESS )
                    mmal_connection_destroy ( *connection );
            }

            return status;
        }